

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void trc_write(Curl_easy *data,curl_infotype type,char *ptr,size_t size)

{
  _Bool value;
  _Bool inCallback;
  size_t size_local;
  char *ptr_local;
  curl_infotype type_local;
  Curl_easy *data_local;
  
  if ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0) {
    if ((data->set).fdebug == (curl_debug_callback)0x0) {
      if (type < CURLINFO_DATA_IN) {
        fwrite(trc_write::s_infotype + type,2,1,(FILE *)(data->set).err);
        fwrite(ptr,size,1,(FILE *)(data->set).err);
      }
    }
    else {
      value = Curl_is_in_callback(data);
      Curl_set_in_callback(data,true);
      (*(data->set).fdebug)(data,type,ptr,size,(data->set).debugdata);
      Curl_set_in_callback(data,value);
    }
  }
  return;
}

Assistant:

static void trc_write(struct Curl_easy *data, curl_infotype type,
                      const char *ptr, size_t size)
{
  if(data->set.verbose) {
    if(data->set.fdebug) {
      bool inCallback = Curl_is_in_callback(data);
      Curl_set_in_callback(data, TRUE);
      (void)(*data->set.fdebug)(data, type, CURL_UNCONST(ptr), size,
                                data->set.debugdata);
      Curl_set_in_callback(data, inCallback);
    }
    else {
      static const char s_infotype[CURLINFO_END][3] = {
        "* ", "< ", "> ", "{ ", "} ", "{ ", "} " };
      switch(type) {
      case CURLINFO_TEXT:
      case CURLINFO_HEADER_OUT:
      case CURLINFO_HEADER_IN:
        fwrite(s_infotype[type], 2, 1, data->set.err);
        fwrite(ptr, size, 1, data->set.err);
        break;
      default: /* nada */
        break;
      }
    }
  }
}